

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall cimg_library::CImg<char>::_system_strescape(CImg<char> *this)

{
  char cVar1;
  char *pcVar2;
  char *values;
  int iVar3;
  unsigned_long uVar4;
  iterator pcVar5;
  CImg<char> *pCVar6;
  CImg<char> local_1c8;
  CImg<char> local_1a8;
  CImg<char> local_188;
  CImg<char> local_168;
  CImg<char> local_148;
  CImg<char> local_128;
  CImg<char> local_108;
  CImg<char> local_e8;
  CImg<char> local_c8;
  CImg<char> local_a8;
  CImg<char> local_88;
  CImg<char> local_58;
  char *local_38;
  char *_maxp;
  char *p;
  char *ptrs;
  CImgList<char> list;
  CImg<char> *this_local;
  
  list._data = this;
  CImgList<char>::CImgList((CImgList<char> *)&ptrs);
  p = this->_data;
  _maxp = this->_data;
  pcVar2 = this->_data;
  uVar4 = size(this);
  local_38 = pcVar2 + uVar4;
  for (; pcVar2 = p, _maxp < local_38; _maxp = _maxp + 1) {
    cVar1 = *_maxp;
    iVar3 = (int)p;
    if (cVar1 == '!') {
      if (_maxp != p) {
        CImg(&local_e8,p,(int)_maxp - iVar3,1,1,1,false);
        move_to<char>(&local_e8,(CImgList<char> *)&ptrs,0xffffffff);
        ~CImg(&local_e8);
      }
      CImg(&local_108,"\"\\!\"",4,1,1,1,false);
      move_to<char>(&local_108,(CImgList<char> *)&ptrs,0xffffffff);
      ~CImg(&local_108);
      p = _maxp + 1;
    }
    else if (cVar1 == '\"') {
      if (_maxp != p) {
        CImg(&local_a8,p,(int)_maxp - iVar3,1,1,1,false);
        move_to<char>(&local_a8,(CImgList<char> *)&ptrs,0xffffffff);
        ~CImg(&local_a8);
      }
      CImg(&local_c8,"\\\"",2,1,1,1,false);
      move_to<char>(&local_c8,(CImgList<char> *)&ptrs,0xffffffff);
      ~CImg(&local_c8);
      p = _maxp + 1;
    }
    else if (cVar1 == '$') {
      if (_maxp != p) {
        CImg(&local_168,p,(int)_maxp - iVar3,1,1,1,false);
        move_to<char>(&local_168,(CImgList<char> *)&ptrs,0xffffffff);
        ~CImg(&local_168);
      }
      CImg(&local_188,"\\$",2,1,1,1,false);
      move_to<char>(&local_188,(CImgList<char> *)&ptrs,0xffffffff);
      ~CImg(&local_188);
      p = _maxp + 1;
    }
    else if (cVar1 == '\\') {
      if (_maxp != p) {
        CImg(&local_58,p,(int)_maxp - iVar3,1,1,1,false);
        move_to<char>(&local_58,(CImgList<char> *)&ptrs,0xffffffff);
        ~CImg(&local_58);
      }
      CImg(&local_88,"\\\\",2,1,1,1,false);
      move_to<char>(&local_88,(CImgList<char> *)&ptrs,0xffffffff);
      ~CImg(&local_88);
      p = _maxp + 1;
    }
    else if (cVar1 == '`') {
      if (_maxp != p) {
        CImg(&local_128,p,(int)_maxp - iVar3,1,1,1,false);
        move_to<char>(&local_128,(CImgList<char> *)&ptrs,0xffffffff);
        ~CImg(&local_128);
      }
      CImg(&local_148,"\\`",2,1,1,1,false);
      move_to<char>(&local_148,(CImgList<char> *)&ptrs,0xffffffff);
      ~CImg(&local_148);
      p = _maxp + 1;
    }
  }
  pcVar5 = end(this);
  values = p;
  if (pcVar2 < pcVar5) {
    pcVar5 = end(this);
    CImg(&local_1a8,values,(int)pcVar5 - (int)p,1,1,1,false);
    move_to<char>(&local_1a8,(CImgList<char> *)&ptrs,0xffffffff);
    ~CImg(&local_1a8);
  }
  CImgList<char>::operator>(&local_1c8,(CImgList<char> *)&ptrs,'x');
  pCVar6 = move_to(&local_1c8,this);
  ~CImg(&local_1c8);
  CImgList<char>::~CImgList((CImgList<char> *)&ptrs);
  return pCVar6;
}

Assistant:

CImg<T>& _system_strescape() {
#define cimg_system_strescape(c,s) case c : if (p!=ptrs) CImg<T>(ptrs,(unsigned int)(p-ptrs),1,1,1,false).\
      move_to(list); \
      CImg<T>(s,(unsigned int)std::strlen(s),1,1,1,false).move_to(list); ptrs = p + 1; break
      CImgList<T> list;
      const T *ptrs = _data;
      cimg_for(*this,p,T) switch ((int)*p) {
        cimg_system_strescape('\\',"\\\\");
        cimg_system_strescape('\"',"\\\"");
        cimg_system_strescape('!',"\"\\!\"");
        cimg_system_strescape('`',"\\`");
        cimg_system_strescape('$',"\\$");
      }
      if (ptrs<end()) CImg<T>(ptrs,(unsigned int)(end()-ptrs),1,1,1,false).move_to(list);
      return (list>'x').move_to(*this);
    }